

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseQuotedText(WastParser *this,string *text,bool check_utf8)

{
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  byte c;
  char c_00;
  bool bVar2;
  TokenType TVar3;
  Result RVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  char cVar8;
  uint32_t digit;
  Token token;
  uint32_t local_94;
  WastParser *local_90;
  uint local_88 [6];
  Token local_70;
  
  TVar3 = Peek(this,0);
  if (TVar3 == Text) {
    Consume(&local_70,this);
    if (5 < local_70.token_type_ - AlignEqNat) {
      __assert_fail("HasText()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/token.h"
                    ,99,"std::string_view wabt::Token::text() const");
    }
    if (2 < local_70.field_2.text_._M_len) {
      pcVar5 = (char *)(local_70.field_2.literal_.text._M_len + 1);
      if (pcVar5 < local_70.field_2.text_._M_str + (local_70.field_2.text_._M_len - 1)) {
        local_90 = this;
        do {
          cVar8 = (char)text;
          if (*pcVar5 == '\\') {
            pcVar6 = pcVar5 + 1;
            c = pcVar5[1];
            if (c < 0x6e) {
              if (((c != 0x22) && (c != 0x27)) && (c != 0x5c)) goto switchD_00156a79_caseD_6f;
            }
            else {
              switch(c) {
              case 0x6e:
                break;
              default:
switchD_00156a79_caseD_6f:
                RVar4 = ParseHexdigit(c,local_88);
                if ((RVar4.enum_ != Ok) ||
                   (RVar4 = ParseHexdigit(pcVar5[2],&local_94), RVar4.enum_ != Ok)) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                                ,0x83,
                                "void wabt::(anonymous namespace)::RemoveEscapes(std::string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::basic_string<char>>]"
                               );
                }
                pcVar5 = pcVar5 + 2;
                goto LAB_00156a8b;
              case 0x72:
                break;
              case 0x74:
                break;
              case 0x75:
                c_00 = pcVar5[3];
                pcVar6 = pcVar5 + 3;
                uVar7 = 0;
                do {
                  RVar4 = ParseHexdigit(c_00,local_88);
                  if (RVar4.enum_ != Ok) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                                  ,0x5b,
                                  "void wabt::(anonymous namespace)::RemoveEscapes(std::string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::basic_string<char>>]"
                                 );
                  }
                  uVar7 = uVar7 << 4 | local_88[0];
                  c_00 = pcVar6[1];
                  pcVar6 = pcVar6 + 1;
                } while (c_00 != '}');
                if (0x10ffff < uVar7) {
                  __assert_fail("scalar_value < 0x110000",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                                ,0x61,
                                "void wabt::(anonymous namespace)::RemoveEscapes(std::string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::basic_string<char>>]"
                               );
                }
                if (0x7f < uVar7) {
                  if (0x7ff < uVar7) {
                    if (0xffff < uVar7) {
                      std::__cxx11::string::push_back(cVar8);
                    }
                    std::__cxx11::string::push_back(cVar8);
                  }
                  std::__cxx11::string::push_back(cVar8);
                }
                std::__cxx11::string::push_back(cVar8);
                this = local_90;
                goto LAB_00156b49;
              }
            }
            std::__cxx11::string::push_back(cVar8);
          }
          else {
LAB_00156a8b:
            std::__cxx11::string::push_back(cVar8);
            pcVar6 = pcVar5;
          }
LAB_00156b49:
          pcVar5 = pcVar6 + 1;
        } while (pcVar5 < local_70.field_2.text_._M_str + (local_70.field_2.text_._M_len - 1));
      }
    }
    if ((check_utf8) &&
       (bVar2 = IsValidUtf8((text->_M_dataplus)._M_p,text->_M_string_length), !bVar2)) {
      Error(this,0x1a8708);
    }
    RVar4.enum_ = Ok;
  }
  else {
    paVar1 = &local_70.loc.field_1;
    local_70.loc.filename._M_len = (size_t)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"a quoted string","");
    local_88[0] = 0;
    local_88[1] = 0;
    local_88[2] = 0;
    local_88[3] = 0;
    local_88[4] = 0;
    local_88[5] = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_88,
               &local_70,&local_70.token_type_);
    RVar4 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_88,"\"foo\"");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_88);
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_70.loc.filename._M_len != paVar1) {
      operator_delete((void *)local_70.loc.filename._M_len,
                      CONCAT44(local_70.loc.field_1.field_0.first_column,
                               local_70.loc.field_1.field_0.line) + 1);
    }
  }
  return (Result)RVar4.enum_;
}

Assistant:

Result WastParser::ParseQuotedText(std::string* text, bool check_utf8) {
  WABT_TRACE(ParseQuotedText);
  if (!PeekMatch(TokenType::Text)) {
    return ErrorExpected({"a quoted string"}, "\"foo\"");
  }

  Token token = Consume();
  RemoveEscapes(token.text(), std::back_inserter(*text));
  if (check_utf8 && !IsValidUtf8(text->data(), text->length())) {
    Error(token.loc, "quoted string has an invalid utf-8 encoding");
  }
  return Result::Ok;
}